

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O1

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration
          (EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y,int Theta)

{
  int iVar1;
  uint uVar2;
  sbpl_xy_theta_pt_t pose;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> local_98;
  double local_78;
  double dStack_70;
  double local_68;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar3 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                    ((EnvironmentNAVXYTHETALATTICE *)this,X,Y,Theta);
  if (bVar3) {
    local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
               EnvNAVXYTHETALATCfg.cellsize_m;
    dStack_70 = 0.0;
    local_68 = DiscTheta2Cont(Theta,(this->super_EnvironmentNAVXYTHETALAT).
                                    super_EnvironmentNAVXYTHETALATTICE.EnvNAVXYTHETALATCfg.
                                    NumThetaDirs);
    bVar3 = this->numofadditionalzlevs < 1;
    if (0 < this->numofadditionalzlevs) {
      dStack_70 = local_78 * 0.5;
      dVar7 = local_78 * (double)Y;
      local_78 = dStack_70 + local_78 * (double)X;
      dStack_70 = dStack_70 + dVar7;
      lVar6 = 0;
      do {
        if (local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                  (&local_60,this->AddLevelFootprintPolygonV + lVar6);
        local_48 = local_78;
        dStack_40 = dStack_70;
        local_38 = local_68;
        pose.y = dStack_70;
        pose.x = local_78;
        pose.theta = local_68;
        get_2d_footprint_cells
                  (&local_60,&local_98,pose,
                   (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                   EnvNAVXYTHETALATCfg.cellsize_m);
        if (local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar4 = (long)local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        if (0 < (int)(uint)uVar4) {
          uVar5 = 0;
          do {
            if (uVar4 == uVar5) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar4);
            }
            iVar1 = local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar5].x;
            if (((long)iVar1 < 0) ||
               ((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.EnvWidth_c <= iVar1)) goto LAB_0012de46;
            uVar2 = local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar5].y;
            if (((int)uVar2 < 0) ||
               (((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                 EnvNAVXYTHETALATCfg.EnvHeight_c <= (int)uVar2 ||
                ((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                 EnvNAVXYTHETALATCfg.obsthresh <= this->AddLevelGrid2D[lVar6][iVar1][uVar2]))))
            goto LAB_0012de46;
            uVar5 = uVar5 + 1;
          } while (((uint)uVar4 & 0x7fffffff) != uVar5);
        }
        lVar6 = lVar6 + 1;
        bVar3 = this->numofadditionalzlevs <= lVar6;
      } while (lVar6 < this->numofadditionalzlevs);
    }
LAB_0012de46:
    if (local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration(int X, int Y, int Theta)
{
    //check the base footprint first
    if (!EnvironmentNAVXYTHETALAT::IsValidConfiguration(X, Y, Theta)) return false;

    //check the remaining levels now
    vector<sbpl_2Dcell_t> footprint;
    sbpl_xy_theta_pt_t pose;

    //compute continuous pose
    pose.x = DISCXY2CONT(X, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.y = DISCXY2CONT(Y, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.theta = DiscTheta2Cont(Theta, EnvNAVXYTHETALATCfg.NumThetaDirs);

    //iterate over additional levels
    for (int levind = 0; levind < numofadditionalzlevs; levind++) {

        //compute footprint cells
        footprint.clear();
        get_2d_footprint_cells(AddLevelFootprintPolygonV[levind], &footprint, pose, EnvNAVXYTHETALATCfg.cellsize_m);

        //iterate over all footprint cells
        for (int find = 0; find < (int)footprint.size(); find++) {
            int x = footprint.at(find).x;
            int y = footprint.at(find).y;

            if (x < 0 || x >= EnvNAVXYTHETALATCfg.EnvWidth_c || y < 0 || y >= EnvNAVXYTHETALATCfg.EnvHeight_c
                || AddLevelGrid2D[levind][x][y] >= EnvNAVXYTHETALATCfg.obsthresh) {
                return false;
            }
        }
    }

    return true;
}